

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O3

int Aig_ManSeqCleanupBasic(Aig_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  
  Aig_ManIncrementTravId(p);
  iVar3 = p->nTravIds;
  p->pConst1->TravId = iVar3;
  uVar8 = p->nRegs;
  uVar14 = (ulong)uVar8;
  if ((int)uVar8 < p->nObjs[2]) {
    pVVar4 = p->vCis;
    uVar11 = pVVar4->nSize;
    uVar12 = 0;
    uVar13 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar13 = uVar12;
    }
    do {
      if (uVar13 == uVar12) goto LAB_006d76d7;
      *(int *)((long)pVVar4->pArray[uVar12] + 0x20) = iVar3;
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)p->nObjs[2] - (long)(int)uVar8);
  }
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  lVar15 = 0;
  if ((int)uVar8 < p->nObjs[3]) {
    uVar13 = 100;
    lVar7 = 0;
    do {
      if (p->vCos->nSize <= lVar7) goto LAB_006d76d7;
      pvVar1 = p->vCos->pArray[lVar7];
      iVar3 = (int)uVar13;
      if ((int)lVar7 == iVar3) {
        if (iVar3 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
          uVar13 = 0x10;
        }
        else {
          uVar13 = (ulong)(uint)(iVar3 * 2);
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(uVar13 * 8);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,uVar13 * 8);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar3 * 2;
        }
      }
      else {
        ppvVar5 = pVVar4->pArray;
      }
      lVar15 = lVar7 + 1;
      pVVar4->nSize = (int)lVar15;
      ppvVar5[lVar7] = pvVar1;
      uVar14 = (ulong)p->nRegs;
      lVar7 = lVar15;
    } while (lVar15 < (long)((long)p->nObjs[3] - uVar14));
  }
  iVar3 = (int)lVar15;
  if (0 < (int)uVar14) {
    iVar2 = 0;
    do {
      uVar8 = (p->nObjs[3] - (int)uVar14) + iVar2;
      if (((((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) ||
          (uVar11 = (p->nObjs[2] - (int)uVar14) + iVar2, (int)uVar11 < 0)) ||
         (p->vCis->nSize <= (int)uVar11)) goto LAB_006d76d7;
      *(void **)p->vCis->pArray[uVar11] = p->vCos->pArray[uVar8];
      iVar2 = iVar2 + 1;
      uVar14 = (ulong)(uint)p->nRegs;
    } while (iVar2 < p->nRegs);
  }
  if (0 < iVar3) {
    lVar15 = 0;
    do {
      Aig_ManSeqCleanup_rec(p,(Aig_Obj_t *)pVVar4->pArray[lVar15],pVVar4);
      lVar15 = lVar15 + 1;
      iVar3 = pVVar4->nSize;
    } while (lVar15 < iVar3);
  }
  iVar2 = p->nObjs[3];
  if (iVar2 < iVar3) {
    __assert_fail("Vec_PtrSize(vNodes) <= Aig_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigScl.c"
                  ,0x119,"int Aig_ManSeqCleanupBasic(Aig_Man_t *)");
  }
  iVar9 = p->nRegs;
  if (0 < iVar9) {
    iVar2 = 0;
    do {
      iVar10 = (p->nObjs[3] - iVar9) + iVar2;
      if (((iVar10 < 0) || (p->vCos->nSize <= iVar10)) ||
         ((uVar8 = (p->nObjs[2] - iVar9) + iVar2, (int)uVar8 < 0 || (p->vCis->nSize <= (int)uVar8)))
         ) {
LAB_006d76d7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      *(undefined8 *)p->vCis->pArray[uVar8] = 0;
      iVar2 = iVar2 + 1;
      iVar9 = p->nRegs;
    } while (iVar2 < iVar9);
    iVar2 = p->nObjs[3];
  }
  if ((iVar3 < iVar2) && (pVVar6 = p->vCos, 0 < pVVar6->nSize)) {
    lVar15 = 0;
    do {
      if (((Aig_Obj_t *)pVVar6->pArray[lVar15])->TravId != p->nTravIds) {
        Aig_ObjPatchFanin0(p,(Aig_Obj_t *)pVVar6->pArray[lVar15],
                           (Aig_Obj_t *)((ulong)p->pConst1 ^ 1));
        pVVar6 = p->vCos;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar6->nSize);
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  iVar3 = Aig_ManCleanup(p);
  return iVar3;
}

Assistant:

int Aig_ManSeqCleanupBasic( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
//    assert( Aig_ManBufNum(p) == 0 );

    // mark the PIs
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );

    // prepare to collect nodes reachable from POs
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManForEachPoSeq( p, pObj, i )
        Vec_PtrPush( vNodes, pObj );

    // remember latch inputs in latch outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi;
    // mark the nodes reachable from these nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ManSeqCleanup_rec( p, pObj, vNodes );
    assert( Vec_PtrSize(vNodes) <= Aig_ManCoNum(p) );
    // clean latch output pointers
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = NULL;

    // if some latches are removed, update PIs/POs
    if ( Vec_PtrSize(vNodes) < Aig_ManCoNum(p) )
    {
        // add constant drivers to the dangling latches
        Aig_ManForEachCo( p, pObj, i )
            if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
                Aig_ObjPatchFanin0( p, pObj, Aig_ManConst0(p) );
    }
    Vec_PtrFree( vNodes );
    // remove dangling nodes
    return Aig_ManCleanup( p );
}